

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void pbrt::
     LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [23],char (*args_1) [4],
               char (*args_2) [23],char *args_3,char (*args_4) [4],char *args_5)

{
  char *in_stack_ffffffffffffffb8;
  string local_40;
  
  StringPrintf<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
            (&local_40,(pbrt *)fmt,*args,(char (*) [23])args_1,(char (*) [4])args_2,
             (char (*) [23])args_3,*args_4,(char (*) [4])args_5,in_stack_ffffffffffffffb8);
  LogFatal(level,file,line,local_40._M_dataplus._M_p);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}